

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomCustomWidget::read(DomCustomWidget *this,int __fd,void *__buf,size_t __nbytes)

{
  int *piVar1;
  int iVar2;
  DomHeader *this_00;
  DomSize *this_01;
  long lVar3;
  DomSlots *this_02;
  DomPropertySpecifications *this_03;
  char16_t *pcVar4;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  undefined4 in_register_00000034;
  QString *pQVar5;
  char *pcVar6;
  QString *this_04;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_80;
  QString local_68;
  char *local_50;
  QStringView local_48;
  long local_38;
  
  pQVar5 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QXmlStreamReader::error();
  if (iVar2 == 0) {
    do {
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) {
        if (iVar2 != 5) goto LAB_0015e113;
        break;
      }
      local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = (QStringView)QXmlStreamReader::name();
      QVar7.m_data = L"class";
      QVar7.m_size = 5;
      iVar2 = QtPrivate::compareStrings(local_48,QVar7,CaseInsensitive);
      if (iVar2 == 0) {
        QXmlStreamReader::readElementText(&local_68,pQVar5,0);
        *(byte *)&this->m_children = (byte)this->m_children | 1;
        this_04 = &this->m_class;
LAB_0015e051:
        QString::operator=(this_04,&local_68);
LAB_0015e059:
        piVar1 = (int *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT44(local_68.d.d._4_4_,local_68.d.d._0_4_),2,0x10);
          }
        }
      }
      else {
        QVar8.m_data = L"extends";
        QVar8.m_size = 7;
        iVar2 = QtPrivate::compareStrings(local_48,QVar8,CaseInsensitive);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_68,pQVar5,0);
          *(byte *)&this->m_children = (byte)this->m_children | 2;
          this_04 = &this->m_extends;
          goto LAB_0015e051;
        }
        QVar9.m_data = L"header";
        QVar9.m_size = 6;
        pcVar4 = L"header";
        iVar2 = QtPrivate::compareStrings(local_48,QVar9,CaseInsensitive);
        if (iVar2 != 0) {
          QVar10.m_data = L"sizehint";
          QVar10.m_size = 8;
          pcVar4 = L"sizehint";
          iVar2 = QtPrivate::compareStrings(local_48,QVar10,CaseInsensitive);
          if (iVar2 == 0) {
            this_01 = (DomSize *)operator_new(0xc);
            this_01->m_children = 0;
            this_01->m_width = 0;
            this_01->m_height = 0;
            DomSize::read(this_01,__fd,__buf_01,(size_t)pcVar4);
            if (this->m_sizeHint != (DomSize *)0x0) {
              operator_delete(this->m_sizeHint,0xc);
            }
            *(byte *)&this->m_children = (byte)this->m_children | 8;
            this->m_sizeHint = this_01;
            goto LAB_0015e113;
          }
          QVar11.m_data = L"addpagemethod";
          QVar11.m_size = 0xd;
          iVar2 = QtPrivate::compareStrings(local_48,QVar11,CaseInsensitive);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_68,pQVar5,0);
            *(byte *)&this->m_children = (byte)this->m_children | 0x10;
            this_04 = &this->m_addPageMethod;
            goto LAB_0015e051;
          }
          QVar12.m_data = L"container";
          QVar12.m_size = 9;
          iVar2 = QtPrivate::compareStrings(local_48,QVar12,CaseInsensitive);
          if (iVar2 != 0) {
            QVar13.m_data = L"sizepolicy";
            QVar13.m_size = 10;
            iVar2 = QtPrivate::compareStrings(local_48,QVar13,CaseInsensitive);
            if (iVar2 == 0) {
              pcVar6 = "Omitting deprecated element <sizepolicy>.";
            }
            else {
              QVar14.m_data = L"pixmap";
              QVar14.m_size = 6;
              iVar2 = QtPrivate::compareStrings(local_48,QVar14,CaseInsensitive);
              if (iVar2 == 0) {
                QXmlStreamReader::readElementText(&local_68,pQVar5,0);
                *(byte *)&this->m_children = (byte)this->m_children | 0x40;
                this_04 = &this->m_pixmap;
                goto LAB_0015e051;
              }
              QVar15.m_data = L"script";
              QVar15.m_size = 6;
              iVar2 = QtPrivate::compareStrings(local_48,QVar15,CaseInsensitive);
              if (iVar2 == 0) {
                pcVar6 = "Omitting deprecated element <script>.";
              }
              else {
                QVar16.m_data = L"properties";
                QVar16.m_size = 10;
                iVar2 = QtPrivate::compareStrings(local_48,QVar16,CaseInsensitive);
                if (iVar2 != 0) {
                  QVar17.m_data = L"slots";
                  QVar17.m_size = 5;
                  pcVar4 = L"slots";
                  iVar2 = QtPrivate::compareStrings(local_48,QVar17,CaseInsensitive);
                  if (iVar2 == 0) {
                    this_02 = (DomSlots *)operator_new(0x38);
                    *(undefined8 *)this_02 = 0;
                    (this_02->m_signal).d.d = (Data *)0x0;
                    (this_02->m_signal).d.ptr = (QString *)0x0;
                    (this_02->m_signal).d.size = 0;
                    (this_02->m_slot).d.d = (Data *)0x0;
                    (this_02->m_slot).d.ptr = (QString *)0x0;
                    (this_02->m_slot).d.size = 0;
                    DomSlots::read(this_02,__fd,__buf_02,(size_t)pcVar4);
                    setElementSlots(this,this_02);
                  }
                  else {
                    QVar18.m_data = L"propertyspecifications";
                    QVar18.m_size = 0x16;
                    pcVar4 = L"propertyspecifications";
                    iVar2 = QtPrivate::compareStrings(local_48,QVar18,CaseInsensitive);
                    if (iVar2 != 0) {
                      local_80.a.m_size = 0x13;
                      local_80.a.m_data = "Unexpected element ";
                      local_80.b = &local_48;
                      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                                (&local_68,&local_80);
                      QXmlStreamReader::raiseError(pQVar5);
                      goto LAB_0015e059;
                    }
                    this_03 = (DomPropertySpecifications *)operator_new(0x38);
                    *(undefined8 *)this_03 = 0;
                    (this_03->m_tooltip).d.d = (Data *)0x0;
                    (this_03->m_tooltip).d.ptr = (DomPropertyToolTip **)0x0;
                    (this_03->m_tooltip).d.size = 0;
                    (this_03->m_stringpropertyspecification).d.d = (Data *)0x0;
                    (this_03->m_stringpropertyspecification).d.ptr =
                         (DomStringPropertySpecification **)0x0;
                    (this_03->m_stringpropertyspecification).d.size = 0;
                    DomPropertySpecifications::read(this_03,__fd,__buf_03,(size_t)pcVar4);
                    setElementPropertyspecifications(this,this_03);
                  }
                  goto LAB_0015e113;
                }
                pcVar6 = "Omitting deprecated element <properties>.";
              }
            }
            local_50 = "default";
            local_68.d.size._4_4_ = 0;
            local_68.d.size._0_4_ = 0;
            local_68.d.ptr._4_4_ = 0;
            local_68.d.ptr._0_4_ = 0;
            local_68.d.d._4_4_ = 0;
            local_68.d.d._0_4_ = 2;
            QMessageLogger::warning((char *)&local_68,pcVar6);
            QXmlStreamReader::skipCurrentElement();
            goto LAB_0015e113;
          }
          QXmlStreamReader::readElementText(&local_68,pQVar5,0);
          QVar19.m_data._4_4_ = local_68.d.ptr._4_4_;
          QVar19.m_data._0_4_ = local_68.d.ptr._0_4_;
          QVar19.m_size._4_4_ = local_68.d.size._4_4_;
          QVar19.m_size._0_4_ = (undefined4)local_68.d.size;
          lVar3 = QString::toIntegral_helper(QVar19,(bool *)0x0,10);
          iVar2 = (int)lVar3;
          if (iVar2 != lVar3) {
            iVar2 = 0;
          }
          *(byte *)&this->m_children = (byte)this->m_children | 0x20;
          this->m_container = iVar2;
          goto LAB_0015e059;
        }
        this_00 = (DomHeader *)operator_new(0x38);
        (this_00->m_text).d.d = (Data *)0x0;
        (this_00->m_text).d.ptr = (char16_t *)0x0;
        (this_00->m_text).d.size = 0;
        (this_00->m_attr_location).d.d = (Data *)0x0;
        (this_00->m_attr_location).d.ptr = (char16_t *)0x0;
        (this_00->m_attr_location).d.size = 0;
        *(undefined8 *)&this_00->m_has_attr_location = 0;
        DomHeader::read(this_00,__fd,__buf_00,(size_t)pcVar4);
        setElementHeader(this,this_00);
      }
LAB_0015e113:
      iVar2 = QXmlStreamReader::error();
    } while (iVar2 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomCustomWidget::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"class"_s, Qt::CaseInsensitive)) {
                setElementClass(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"extends"_s, Qt::CaseInsensitive)) {
                setElementExtends(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"header"_s, Qt::CaseInsensitive)) {
                auto *v = new DomHeader();
                v->read(reader);
                setElementHeader(v);
                continue;
            }
            if (!tag.compare(u"sizehint"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSize();
                v->read(reader);
                setElementSizeHint(v);
                continue;
            }
            if (!tag.compare(u"addpagemethod"_s, Qt::CaseInsensitive)) {
                setElementAddPageMethod(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"container"_s, Qt::CaseInsensitive)) {
                setElementContainer(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"sizepolicy"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <sizepolicy>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"pixmap"_s, Qt::CaseInsensitive)) {
                setElementPixmap(reader.readElementText());
                continue;
            }
            if (!tag.compare(u"script"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <script>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"properties"_s, Qt::CaseInsensitive)) {
                qWarning("Omitting deprecated element <properties>.");
                reader.skipCurrentElement();
                continue;
            }
            if (!tag.compare(u"slots"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSlots();
                v->read(reader);
                setElementSlots(v);
                continue;
            }
            if (!tag.compare(u"propertyspecifications"_s, Qt::CaseInsensitive)) {
                auto *v = new DomPropertySpecifications();
                v->read(reader);
                setElementPropertyspecifications(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}